

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O2

void update(TCHmacPrng_t prng,uint8_t *e,uint len)

{
  uint8_t *tag;
  uint8_t *tag_00;
  undefined1 local_32;
  undefined1 local_31 [7];
  uint8_t separator0;
  uint8_t separator1;
  
  local_32 = 0;
  local_31[0] = 1;
  tc_hmac_init(&prng->h);
  tag = prng->v;
  tc_hmac_update(&prng->h,tag,0x20);
  tc_hmac_update(&prng->h,&local_32,1);
  tc_hmac_update(&prng->h,e,len);
  tag_00 = prng->key;
  tc_hmac_final(tag_00,0x20,&prng->h);
  tc_hmac_set_key(&prng->h,tag_00,0x20);
  tc_hmac_init(&prng->h);
  tc_hmac_update(&prng->h,tag,0x20);
  tc_hmac_final(tag,0x20,&prng->h);
  tc_hmac_init(&prng->h);
  tc_hmac_update(&prng->h,tag,0x20);
  tc_hmac_update(&prng->h,local_31,1);
  tc_hmac_update(&prng->h,e,len);
  tc_hmac_final(tag_00,0x20,&prng->h);
  tc_hmac_set_key(&prng->h,tag_00,0x20);
  tc_hmac_init(&prng->h);
  tc_hmac_update(&prng->h,tag,0x20);
  tc_hmac_final(tag,0x20,&prng->h);
  return;
}

Assistant:

static void update(TCHmacPrng_t prng, const uint8_t *e, unsigned int len)
{
	const uint8_t separator0 = 0x00;
	const uint8_t separator1 = 0x01;

	/* use current state, e and separator 0 to compute a new prng key: */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_update(&prng->h, &separator0, sizeof(separator0));
	(void)tc_hmac_update(&prng->h, e, len);
	(void)tc_hmac_final(prng->key, sizeof(prng->key), &prng->h);
	/* configure the new prng key into the prng's instance of hmac */
	(void)tc_hmac_set_key(&prng->h, prng->key, sizeof(prng->key));

	/* use the new key to compute a new state variable v */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);

	/* use current state, e and separator 1 to compute a new prng key: */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_update(&prng->h, &separator1, sizeof(separator1));
	(void)tc_hmac_update(&prng->h, e, len);
	(void)tc_hmac_final(prng->key, sizeof(prng->key), &prng->h);
	/* configure the new prng key into the prng's instance of hmac */
	(void)tc_hmac_set_key(&prng->h, prng->key, sizeof(prng->key));

	/* use the new key to compute a new state variable v */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);
}